

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  bool bVar1;
  undefined1 in_DL;
  long *in_RDI;
  Extension *extension;
  size_t n;
  size_t in_stack_fffffffffffffe60;
  type_info *in_stack_fffffffffffffe68;
  Arena *in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffe78;
  ArenaImpl *in_stack_fffffffffffffe80;
  Extension **in_stack_fffffffffffffe88;
  FieldDescriptor *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  ExtensionSet *in_stack_fffffffffffffea0;
  undefined8 *local_80;
  string *local_38;
  
  bVar1 = MaybeNewExtension(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                            in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (bVar1) {
    *(undefined1 *)(local_80 + 1) = in_DL;
    *(undefined1 *)((long)local_80 + 9) = 0;
    if (*in_RDI == 0) {
      local_38 = (string *)operator_new(0x20);
      std::__cxx11::string::string(local_38);
    }
    else {
      AlignUpTo8(0x20);
      Arena::AllocHook(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60
                      );
      local_38 = (string *)
                 ArenaImpl::AllocateAlignedAndAddCleanup
                           (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                            (_func_void_void_ptr *)in_stack_fffffffffffffe70);
      std::__cxx11::string::string(local_38);
    }
    *local_80 = local_38;
  }
  *(byte *)((long)local_80 + 10) = *(byte *)((long)local_80 + 10) & 0xf0;
  return (string *)*local_80;
}

Assistant:

std::string* ExtensionSet::MutableString(int number, FieldType type,
                                         const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = false;
    extension->string_value = Arena::Create<std::string>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
  }
  extension->is_cleared = false;
  return extension->string_value;
}